

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

ExprEnv * __thiscall Omega_h::ExprEnv::string_abi_cxx11_(ExprEnv *this,int verbose)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  undefined4 in_register_00000034;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
  *this_00;
  string local_3f0 [32];
  Omega_h local_3d0 [8];
  string str;
  undefined1 local_3b0 [8];
  any v;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
  i;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
  *__range1;
  string local_340 [8];
  string sep;
  ostringstream local_310 [8];
  ostringstream vs;
  ostringstream local_198 [8];
  ostringstream oss;
  int verbose_local;
  ExprEnv *this_local;
  
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
             *)CONCAT44(in_register_00000034,verbose);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"",(allocator *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
           ::begin(this_00);
  i.second.vtable =
       (vtable_type *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i.second.vtable);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
            *)&v.vtable,ppVar2);
    any::any((any *)local_3b0,(any *)&i.field_0x18);
    any_cast<std::__cxx11::string>(local_3d0,(any *)local_3b0);
    poVar3 = std::operator<<((ostream *)local_310,local_340);
    poVar3 = std::operator<<(poVar3,"{");
    poVar3 = std::operator<<(poVar3,(string *)&v.vtable);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,(string *)local_3d0);
    std::operator<<(poVar3,"}");
    std::__cxx11::string::operator=(local_340," ");
    std::__cxx11::string::~string((string *)local_3d0);
    any::~any((any *)local_3b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
             *)&v.vtable);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>
    ::operator++(&__end1);
  }
  poVar3 = std::operator<<((ostream *)local_198,"ExprEnv:");
  poVar3 = std::operator<<(poVar3,"\n  size      = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&this_00[2]._M_t._M_impl);
  poVar3 = std::operator<<(poVar3,"\n  dim       = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&this_00[2]._M_t._M_impl.field_0x4);
  poVar3 = std::operator<<(poVar3,"\n  variables = ");
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar3,local_3f0);
  std::__cxx11::string::~string(local_3f0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

std::string ExprEnv::string(int verbose) {
  //std::map<std::string, any> variables;
  //std::map<std::string, Function> functions;
  //LO size;
  //Int dim;
  std::ostringstream oss, vs;
  std::string sep = "";
  for(auto i : variables) {
    auto v = i.second;
    std::string str = any_cast<std::string>(v);
    vs << sep << "{" << i.first << " : " << str << "}";
    sep = " ";
  }
  oss << "ExprEnv:"
      << "\n  size      = " << size
      << "\n  dim       = " << dim
      << "\n  variables = " << vs.str();
  (void)verbose;
  return oss.str();
}